

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_stdio_greater_than_3(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  uv_timer_t *puVar4;
  int extraout_EDX;
  uv_process_t *puVar5;
  uv_timer_t *puVar6;
  code *pcVar7;
  char *pcVar8;
  uv_stdio_container_t stdio [4];
  uv_pipe_t pipe;
  int iStack_2bc;
  undefined1 auStack_2b8 [16];
  uv_stdio_container_t uStack_2a8;
  undefined4 uStack_298;
  undefined4 uStack_290;
  undefined4 uStack_288;
  undefined4 uStack_280;
  undefined4 uStack_278;
  int iStack_270;
  code *pcStack_268;
  undefined1 auStack_260 [240];
  code *pcStack_170;
  uv_stdio_container_t local_168;
  undefined4 local_158;
  undefined4 local_148;
  undefined4 local_138;
  undefined1 *local_130;
  undefined1 local_120 [264];
  
  pcStack_170 = (code *)0x16d26e;
  init_process_options("spawn_helper5",exit_cb);
  pcStack_170 = (code *)0x16d273;
  uVar2 = uv_default_loop();
  puVar3 = local_120;
  pcStack_170 = (code *)0x16d287;
  uv_pipe_init(uVar2,puVar3,0);
  local_168.flags = UV_IGNORE;
  local_158 = 0;
  local_148 = 0;
  local_138 = 0x21;
  options.stdio_count = 4;
  pcStack_170 = (code *)0x16d2ba;
  options.stdio = &local_168;
  local_130 = puVar3;
  uVar2 = uv_default_loop();
  pcStack_170 = (code *)0x16d2cc;
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    pcStack_170 = (code *)0x16d2ec;
    iVar1 = uv_read_start(local_120,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0016d3a8;
    pcStack_170 = (code *)0x16d2f9;
    uVar2 = uv_default_loop();
    pcStack_170 = (code *)0x16d303;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0016d3ad;
    if (exit_cb_called != 1) goto LAB_0016d3b2;
    if (close_cb_called != 2) goto LAB_0016d3b7;
    pcStack_170 = (code *)0x16d33a;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT71(output._8_7_,output[7]) != 0xa216f69647473 ||
        CONCAT17(output[7],output._0_7_) != 0x7320687472756f66) goto LAB_0016d3bc;
    pcStack_170 = (code *)0x16d366;
    puVar3 = (undefined1 *)uv_default_loop();
    pcStack_170 = (code *)0x16d37a;
    uv_walk(puVar3,close_walk_cb,0);
    pcStack_170 = (code *)0x16d384;
    uv_run(puVar3,0);
    pcStack_170 = (code *)0x16d389;
    uVar2 = uv_default_loop();
    pcStack_170 = (code *)0x16d391;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_170 = (code *)0x16d3a8;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_0016d3a8:
    pcStack_170 = (code *)0x16d3ad;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_0016d3ad:
    pcStack_170 = (code *)0x16d3b2;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_0016d3b2:
    pcStack_170 = (code *)0x16d3b7;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_0016d3b7:
    pcStack_170 = (code *)0x16d3bc;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_0016d3bc:
    pcStack_170 = (code *)0x16d3c1;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  pcStack_170 = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  pcStack_268 = (code *)0x16d3d2;
  uVar2 = uv_default_loop();
  pcStack_268 = (code *)0x16d3dd;
  iVar1 = uv_tcp_init(uVar2,auStack_260);
  if (iVar1 == 0) {
    pcStack_268 = (code *)0x16d3ee;
    iVar1 = uv_tcp_open(auStack_260,3);
    if (iVar1 != 0) goto LAB_0016d417;
    pcStack_268 = (code *)0x16d401;
    iVar1 = uv_listen(auStack_260,0x1000,0);
    if (iVar1 == 0) {
      return 1;
    }
  }
  else {
    pcStack_268 = (code *)0x16d417;
    spawn_tcp_server_helper_cold_1();
LAB_0016d417:
    pcStack_268 = (code *)0x16d41c;
    spawn_tcp_server_helper_cold_2();
  }
  pcStack_268 = run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  pcStack_268 = (code *)puVar3;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_2b8);
  if (iVar1 == 0) {
    iStack_2bc = -1;
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init_ex(uVar2,&tcp_server,2);
    if (iVar1 != 0) goto LAB_0016d582;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_2b8,0);
    if (iVar1 != 0) goto LAB_0016d587;
    iVar1 = uv_fileno(&tcp_server,&iStack_2bc);
    if (iVar1 != 0) goto LAB_0016d58c;
    if (iStack_2bc < 1) goto LAB_0016d591;
    options.stdio = &uStack_2a8;
    uStack_2a8.flags = UV_INHERIT_FD;
    uStack_2a8.data.fd = 0;
    uStack_298 = 2;
    uStack_290 = 1;
    uStack_288 = 2;
    uStack_280 = 2;
    uStack_278 = 2;
    iStack_270 = iStack_2bc;
    options.stdio_count = 4;
    uVar2 = uv_default_loop();
    iVar1 = uv_spawn(uVar2,&process,&options);
    if (iVar1 != 0) goto LAB_0016d596;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0016d59b;
    if (exit_cb_called != 1) goto LAB_0016d5a0;
    if (close_cb_called != 1) goto LAB_0016d5a5;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_0016d582:
    run_test_spawn_tcp_server_cold_2();
LAB_0016d587:
    run_test_spawn_tcp_server_cold_3();
LAB_0016d58c:
    run_test_spawn_tcp_server_cold_4();
LAB_0016d591:
    run_test_spawn_tcp_server_cold_5();
LAB_0016d596:
    run_test_spawn_tcp_server_cold_6();
LAB_0016d59b:
    run_test_spawn_tcp_server_cold_7();
LAB_0016d5a0:
    run_test_spawn_tcp_server_cold_8();
LAB_0016d5a5:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0016d65c;
    if (exit_cb_called != 1) goto LAB_0016d661;
    if (close_cb_called != 1) goto LAB_0016d666;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0016d65c:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0016d661:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0016d666:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  puVar4 = (uv_timer_t *)uv_default_loop();
  puVar5 = &process;
  iVar1 = uv_spawn(puVar4,&process,&options);
  if (iVar1 == 0) {
    puVar4 = (uv_timer_t *)uv_default_loop();
    puVar6 = &timer;
    iVar1 = uv_timer_init();
    pcVar7 = (code *)puVar6;
    if (iVar1 != 0) goto LAB_0016d743;
    puVar4 = &timer;
    pcVar7 = timer_cb;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar1 != 0) goto LAB_0016d748;
    puVar4 = (uv_timer_t *)uv_default_loop();
    pcVar7 = (code *)0x0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016d74d;
    if (exit_cb_called != 1) goto LAB_0016d752;
    if (close_cb_called != 2) goto LAB_0016d757;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    pcVar7 = (code *)0x0;
    uv_run(uVar2);
    puVar4 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar7 = (code *)puVar5;
LAB_0016d743:
    run_test_spawn_and_kill_cold_2();
LAB_0016d748:
    run_test_spawn_and_kill_cold_3();
LAB_0016d74d:
    run_test_spawn_and_kill_cold_4();
LAB_0016d752:
    run_test_spawn_and_kill_cold_5();
LAB_0016d757:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar8 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar7 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close(puVar4,close_cb);
      pcVar8 = (char *)(ulong)*(uint *)puVar4->heap_node;
      iVar1 = uv_kill(pcVar8,0);
      if (iVar1 == -3) {
        return iVar1;
      }
      goto LAB_0016d7b6;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0016d7b6:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar1 = uv_close(pcVar8,close_cb);
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_stdio_greater_than_3) {
  int r;
  uv_pipe_t pipe;
  uv_stdio_container_t stdio[4];

  init_process_options("spawn_helper5", exit_cb);

  uv_pipe_init(uv_default_loop(), &pipe, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_IGNORE;
  options.stdio[2].flags = UV_IGNORE;
  options.stdio[3].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[3].data.stream = (uv_stream_t*)&pipe;
  options.stdio_count = 4;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &pipe, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2); /* Once for process once for the pipe. */
  printf("output from stdio[3] is: %s", output);
  ASSERT(strcmp("fourth stdio!\n", output) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}